

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgd-walk.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **in_RSI;
  int in_EDI;
  task_struct t;
  uint16_t devn;
  uint16_t busn;
  uintptr_t vaddr;
  uintptr_t addr;
  nettlp nt;
  int pid;
  int ch;
  int ret;
  nettlp *in_stack_fffffffffffffee8;
  task_struct *in_stack_fffffffffffffef8;
  uintptr_t in_stack_ffffffffffffff00;
  nettlp *in_stack_ffffffffffffff08;
  ushort local_4c;
  short local_4a;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_34 [4];
  undefined1 auStack_30 [4];
  ushort local_2c;
  undefined1 local_2a;
  int local_1c;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(local_34,0,0x18);
  local_40 = 0;
  local_4a = 0;
  local_4c = 0;
  local_1c = -1;
  local_48 = 0;
  do {
    local_18 = getopt(local_8,local_10,"r:l:b:t:a:p:v:");
    if (local_18 == -1) {
      local_14 = nettlp_init(in_stack_fffffffffffffee8);
      if (local_14 < 0) {
        perror("nettlp_init");
        return local_14;
      }
      fill_task_struct(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
                      );
      task((nettlp *)t.children_next,(uintptr_t)t.sibling.prev,(uintptr_t)t.sibling.next,
           t.children.prev._4_4_,(uintptr_t)t.children.next);
      return 0;
    }
    in_stack_fffffffffffffee8 = (nettlp *)(ulong)(local_18 - 0x61);
    switch(in_stack_fffffffffffffee8) {
    case (nettlp *)0x0:
      local_14 = __isoc99_sscanf(_optarg,"0x%lx",&local_40);
      break;
    case (nettlp *)0x1:
      local_14 = __isoc99_sscanf(_optarg,"%hx:%hx",&local_4a,&local_4c);
      local_2c = local_4a << 8 | local_4c;
      break;
    default:
      usage();
      return -1;
    case (nettlp *)0xb:
      local_14 = inet_pton(2,_optarg,auStack_30);
      if (local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (nettlp *)0xf:
      local_1c = atoi(_optarg);
      break;
    case (nettlp *)0x11:
      local_14 = inet_pton(2,_optarg,local_34);
      if (local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (nettlp *)0x13:
      iVar1 = atoi(_optarg);
      local_2a = (undefined1)iVar1;
      break;
    case (nettlp *)0x15:
      local_14 = __isoc99_sscanf(_optarg,"0x%lx",&local_48);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, pid;
	struct nettlp nt;
	uintptr_t addr, vaddr;
	uint16_t busn, devn;
	struct task_struct t;

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;
	pid = -1;	/* not mached */
	vaddr = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:p:v:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'p':
			pid = atoi(optarg);
			break;

		case 'v':
			ret = sscanf(optarg, "0x%lx", &vaddr);
			break;

		default :
			usage();
			return -1;
		}
	}


	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}

	fill_task_struct(&nt, addr, &t);

	task(&nt, t.vhead, t.vchildren, pid, vaddr);
	//print_task_struct(&nt, t);
	//dump_task_struct(&t);

	return 0;
}